

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall iqnet::Reactor<iqnet::Null_lock>::~Reactor(Reactor<iqnet::Null_lock> *this)

{
  (this->super_Reactor_base)._vptr_Reactor_base = (_func_int **)&PTR__Reactor_0019c1f8;
  std::__cxx11::
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ::_M_clear(&(this->handlers_states).
              super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
            );
  std::
  _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
  ::~_Rb_tree(&(this->handlers)._M_t);
  Reactor_poll_impl::~Reactor_poll_impl(&this->impl);
  return;
}

Assistant:

~Reactor() {}